

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O1

void player_learn_curse(player *p,curse *curse)

{
  wchar_t wVar1;
  uint uVar2;
  int *piVar3;
  size_t sVar4;
  
  wVar1 = lookup_curse(curse->name);
  uVar2 = 0xffffffff;
  if (rune_max != 0) {
    piVar3 = &rune_list->index;
    sVar4 = 0;
    do {
      if ((((rune *)(piVar3 + -1))->variety == RUNE_VAR_CURSE) && (*piVar3 == wVar1)) {
        uVar2 = (uint)sVar4;
        break;
      }
      sVar4 = sVar4 + 1;
      piVar3 = piVar3 + 6;
    } while (rune_max != sVar4);
  }
  if (-1 < (int)uVar2) {
    player_learn_rune(p,(ulong)uVar2,true);
  }
  update_player_object_knowledge(p);
  return;
}

Assistant:

void player_learn_curse(struct player *p, struct curse *curse)
{
	int index = rune_index(RUNE_VAR_CURSE, lookup_curse(curse->name));
	if (index >= 0) {
		player_learn_rune(p, index, true);
	}
	update_player_object_knowledge(p);
}